

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O3

void dynamic_api_suite::api_ctor_move(void)

{
  undefined8 local_40;
  undefined4 local_34;
  
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x22,"void dynamic_api_suite::api_ctor_move()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x23,"void dynamic_api_suite::api_ctor_move()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x25,"void dynamic_api_suite::api_ctor_move()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x26,"void dynamic_api_suite::api_ctor_move()",&local_40,&local_34);
  return;
}

Assistant:

void api_ctor_move()
{
    map_view<int, int> span;
    BOOST_TEST_EQ(span.capacity(), 0);
    BOOST_TEST_EQ(span.size(), 0);
    map_view<int, int> clone(std::move(span));
    BOOST_TEST_EQ(clone.capacity(), 0);
    BOOST_TEST_EQ(clone.size(), 0);
}